

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

void __thiscall
PacketBuilder::PacketBuilder
          (PacketBuilder *this,PacketFamily family,PacketAction action,size_t size_guess)

{
  ushort uVar1;
  undefined7 in_register_00000031;
  
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  this->add_size = 0;
  uVar1 = (ushort)action << 8 | (ushort)CONCAT71(in_register_00000031,family);
  this->id = -(ushort)(uVar1 == 0) | uVar1;
  std::__cxx11::string::reserve((ulong)&this->data);
  return;
}

Assistant:

PacketBuilder::PacketBuilder(PacketFamily family, PacketAction action, std::size_t size_guess)
	: add_size(0)
{
	this->SetID(family, action);

	this->data.reserve(size_guess);
}